

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argagg.hpp
# Opt level: O2

string * argagg::lstrip(string *__return_storage_ptr__,string *text)

{
  pointer pcVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)text);
  pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<argagg::lstrip(std::__cxx11::string_const&)::_lambda(int)_1_>>
                    (pcVar1,pcVar1 + __return_storage_ptr__->_M_string_length);
  std::__cxx11::string::erase(__return_storage_ptr__,pcVar1,_Var2._M_current);
  return __return_storage_ptr__;
}

Assistant:

inline
std::string lstrip(const std::string& text)
{
  auto result = text;

  result.erase(
    result.begin(),
    std::find_if(
      result.begin(),
      result.end(),
      [](int ch) { return !std::isspace(ch); }));

  return result;
}